

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathedit.cpp
# Opt level: O0

State __thiscall PathValidator::validate(PathValidator *this,QString *text,int *param_2)

{
  PathMode PVar1;
  bool bVar2;
  byte bVar3;
  QDir local_38 [8];
  QFileInfo local_30 [8];
  QFileInfo pathInfo;
  int *param_2_local;
  QString *text_local;
  PathValidator *this_local;
  
  _pathInfo = param_2;
  bVar2 = QString::isEmpty(text);
  if (bVar2) {
    this_local._4_4_ = Intermediate;
    if ((this->allowEmpty & 1U) != 0) {
      this_local._4_4_ = Acceptable;
    }
  }
  else {
    QFileInfo::QFileInfo(local_30,text);
    QFileInfo::dir();
    bVar3 = QDir::exists();
    QDir::~QDir(local_38);
    if (((bVar3 ^ 0xff) & 1) == 0) {
      PVar1 = this->mode;
      if (PVar1 == ExistingFile) {
        bVar3 = QFileInfo::exists();
        if (((bVar3 & 1) == 0) || (bVar3 = QFileInfo::isFile(), (bVar3 & 1) == 0)) {
          this_local._4_4_ = Intermediate;
        }
        else {
          this_local._4_4_ = Acceptable;
        }
      }
      else if (PVar1 == ExistingFolder) {
        bVar3 = QFileInfo::exists();
        if (((bVar3 & 1) == 0) || (bVar3 = QFileInfo::isDir(), (bVar3 & 1) == 0)) {
          this_local._4_4_ = Intermediate;
        }
        else {
          this_local._4_4_ = Acceptable;
        }
      }
      else if (PVar1 == AnyFile) {
        bVar3 = QFileInfo::isDir();
        if ((bVar3 & 1) == 0) {
          this_local._4_4_ = Acceptable;
        }
        else {
          this_local._4_4_ = Intermediate;
        }
      }
    }
    else {
      this_local._4_4_ = Invalid;
    }
    QFileInfo::~QFileInfo(local_30);
  }
  return this_local._4_4_;
}

Assistant:

QValidator::State PathValidator::validate(QString &text, int &) const {
	//check if empty is accepted
	if(text.isEmpty())
		return allowEmpty ? QValidator::Acceptable : QValidator::Intermediate;

	//nonexisting parent dir is not possible
	QFileInfo pathInfo(text);
	if(!pathInfo.dir().exists())
		return QValidator::Invalid;

	switch(mode) {
    case QPathEdit::AnyFile://acceptable, as long as it's not an directoy
      if(pathInfo.isDir())
        return QValidator::Intermediate;
      else
        return QValidator::Acceptable;
    case QPathEdit::ExistingFile://must be an existing file
      if(pathInfo.exists() && pathInfo.isFile())
        return QValidator::Acceptable;
      else
        return QValidator::Intermediate;
    case QPathEdit::ExistingFolder://must be an existing folder
      if(pathInfo.exists() && pathInfo.isDir())
        return QValidator::Acceptable;
      else
        return QValidator::Intermediate;
    default:
      Q_UNREACHABLE();
	}

	return QValidator::Invalid;
}